

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O1

void evthread_debug_lock_mark_unlocked(uint mode,debug_lock *lock)

{
  int iVar1;
  unsigned_long uVar2;
  
  if (lock->signature == 0xdeb0b10c) {
    if ((lock->locktype & 2) == 0) {
      if ((mode & 0xc) != 0) {
        evthread_debug_lock_mark_unlocked_cold_3();
        goto LAB_002dbc08;
      }
    }
    else {
LAB_002dbc08:
      if ((mode & 0xc) == 0) goto LAB_002dbc4e;
    }
    if (evthread_id_fn_ == (_func_unsigned_long *)0x0) {
LAB_002dbc30:
      iVar1 = lock->count;
      lock->count = iVar1 + -1;
      if (0 < iVar1) {
        return;
      }
      goto LAB_002dbc44;
    }
    uVar2 = (*evthread_id_fn_)();
    if (lock->held_by == uVar2) {
      if (lock->count == 1) {
        lock->held_by = 0;
      }
      goto LAB_002dbc30;
    }
  }
  else {
    evthread_debug_lock_mark_unlocked_cold_1();
LAB_002dbc44:
    evthread_debug_lock_mark_unlocked_cold_5();
  }
  evthread_debug_lock_mark_unlocked_cold_4();
LAB_002dbc4e:
  evthread_debug_lock_mark_unlocked_cold_2();
}

Assistant:

static void
evthread_debug_lock_mark_unlocked(unsigned mode, struct debug_lock *lock)
{
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	if (lock->locktype & EVTHREAD_LOCKTYPE_READWRITE)
		EVUTIL_ASSERT(mode & (EVTHREAD_READ|EVTHREAD_WRITE));
	else
		EVUTIL_ASSERT((mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0);
	if (evthread_id_fn_) {
		unsigned long me;
		me = evthread_id_fn_();
		EVUTIL_ASSERT(lock->held_by == me);
		if (lock->count == 1)
			lock->held_by = 0;
	}
	--lock->count;
	EVUTIL_ASSERT(lock->count >= 0);
}